

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_index(jit_State *J,TRef tr)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  IRIns *pIVar3;
  IRIns *ir;
  TRef tr_local;
  jit_State *J_local;
  
  if ((tr & 0x1f000000) == 0xe000000) {
    (J->fold).ins.field_0.ot = 0x5b93;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = 0x226e;
    J_local._4_4_ = lj_opt_fold(J);
  }
  else {
    pIVar3 = (J->cur).ir + (tr & 0xffff);
    J_local._4_4_ = tr;
    if (((((pIVar3->field_1).o == '5') || ((pIVar3->field_1).o == '6')) &&
        ((pIVar3->field_0).op2 < 0x8000)) &&
       ((J->cur).ir[(pIVar3->field_0).op2].field_1.op12 + 0x40000000 < 0x80000000)) {
      IVar1 = (pIVar3->field_0).op1;
      IVar2 = (pIVar3->field_0).op2;
      (J->fold).ins.field_0.ot = ((pIVar3->field_1).o - 0xc) * 0x100 | 0x13;
      (J->fold).ins.field_0.op1 = IVar1;
      (J->fold).ins.field_0.op2 = IVar2;
      J_local._4_4_ = lj_opt_fold(J);
    }
  }
  return J_local._4_4_;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_index(jit_State *J, TRef tr)
{
  IRIns *ir;
  lj_assertJ(tref_isnumber(tr), "expected number type");
  if (tref_isnum(tr))  /* Conversion may be narrowed, too. See above. */
    return emitir(IRTGI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_INDEX);
  /* Omit some overflow checks for array indexing. See comments above. */
  ir = IR(tref_ref(tr));
  if ((ir->o == IR_ADDOV || ir->o == IR_SUBOV) && irref_isk(ir->op2) &&
      (uint32_t)IR(ir->op2)->i + 0x40000000u < 0x80000000u)
    return emitir(IRTI(ir->o - IR_ADDOV + IR_ADD), ir->op1, ir->op2);
  return tr;
}